

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void timer_synchronize(Emulator *e)

{
  u8 *puVar1;
  u16 *puVar2;
  undefined2 uVar3;
  TimerClock TVar4;
  ulong uVar5;
  ulong uVar6;
  Ticks TVar7;
  TimaState TVar8;
  long lVar9;
  
  uVar5 = (e->state).ticks;
  uVar6 = (e->state).timer.sync_ticks;
  if (uVar6 <= uVar5 && uVar5 - uVar6 != 0) {
    (e->state).timer.sync_ticks = uVar5;
    if ((e->state).timer.on == FALSE) {
      puVar2 = &(e->state).timer.div_counter;
      *puVar2 = *puVar2 + (short)(uVar5 - uVar6);
    }
    else {
      TVar7 = (e->state).cpu_tick;
      for (lVar9 = uVar6 - uVar5; lVar9 != 0; lVar9 = lVar9 + TVar7) {
        TVar8 = (e->state).timer.tima_state;
        if (TVar8 == TIMA_STATE_RESET) {
          TVar8 = TIMA_STATE_NORMAL;
LAB_0010a34a:
          (e->state).timer.tima_state = TVar8;
        }
        else if (TVar8 == TIMA_STATE_OVERFLOW) {
          puVar1 = &(e->state).interrupt.if_;
          *puVar1 = *puVar1 | (e->state).interrupt.new_if & 4;
          (e->state).timer.tima = (e->state).timer.tma;
          TVar8 = TIMA_STATE_RESET;
          goto LAB_0010a34a;
        }
        TVar4 = (e->state).timer.clock_select;
        uVar3 = (e->state).timer.div_counter;
        (e->state).timer.div_counter = uVar3 + 4;
        if ((-uVar3 - 5 & s_tima_mask[TVar4] & uVar3) != 0) {
          increment_tima(e);
        }
      }
    }
  }
  return;
}

Assistant:

static void timer_synchronize(Emulator* e) {
  if (TICKS > TIMER.sync_ticks) {
    Ticks delta_ticks = TICKS - TIMER.sync_ticks;
    TIMER.sync_ticks = TICKS;

    if (TIMER.on) {
      Ticks cpu_tick = e->state.cpu_tick;
      for (; delta_ticks > 0; delta_ticks -= cpu_tick) {
        if (TIMER.tima_state == TIMA_STATE_OVERFLOW) {
          INTR.if_ |= (INTR.new_if & IF_TIMER);
          TIMER.tima = TIMER.tma;
          TIMER.tima_state = TIMA_STATE_RESET;
        } else if (TIMER.tima_state == TIMA_STATE_RESET) {
          TIMER.tima_state = TIMA_STATE_NORMAL;
        }
        u16 old_div_counter = TIMER.div_counter;
        TIMER.div_counter += CPU_TICK;
        if (is_div_falling_edge(e, old_div_counter, TIMER.div_counter)) {
          increment_tima(e);
        }
      }
    } else {
      TIMER.div_counter += delta_ticks;
    }
  }
}